

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

void write_action_result_type(Context *ctx,Var obj,PropertyId id,Script *script,ActionPtr *action)

{
  Export *this;
  ActionType AVar1;
  Type type;
  pointer pAVar2;
  Global *pGVar3;
  Var pvVar4;
  Var typeObj_1;
  Global *global;
  Var local_70;
  Var typeObj;
  Index i;
  Index num_results;
  Func *func;
  Var local_48;
  Var resultArr;
  Export *export_;
  Module *module;
  ActionPtr *action_local;
  Script *script_local;
  Var pvStack_18;
  PropertyId id_local;
  Var obj_local;
  Context *ctx_local;
  
  module = (Module *)action;
  action_local = (ActionPtr *)script;
  script_local._4_4_ = id;
  pvStack_18 = obj;
  obj_local = ctx;
  pAVar2 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->(action);
  export_ = (Export *)wabt::Script::GetModule(script,&pAVar2->module_var);
  local_48 = (Var)(**(code **)(*(long *)(*obj_local + 8) + 0x28))
                            (*(undefined8 *)(*obj_local + 0x10));
  set_property((Context *)obj_local,pvStack_18,script_local._4_4_,local_48,
               "Unable to set action result type");
  pAVar2 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                     ((unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_> *)module);
  AVar1 = wabt::Action::type(pAVar2);
  this = export_;
  if (AVar1 == Invoke) {
    pAVar2 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                       ((unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_> *)module);
    wabt::string_view::string_view((string_view *)&func,&pAVar2->name);
    resultArr = wabt::Module::GetExport((Module *)this,_func);
    if (((Export *)resultArr)->kind != First) {
      __assert_fail("export_->kind == ExternalKind::Func",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,0xe9,
                    "void write_action_result_type(Context *, Js::Var, PropertyId, Script *, const ActionPtr &)"
                   );
    }
    _i = wabt::Module::GetFunc((Module *)export_,&((Export *)resultArr)->var);
    typeObj._4_4_ = wabt::Func::GetNumResults(_i);
    for (typeObj._0_4_ = 0; pvVar4 = obj_local, (uint)typeObj < typeObj._4_4_;
        typeObj._0_4_ = (uint)typeObj + 1) {
      type = wabt::Func::GetResultType(_i,(uint)typeObj);
      local_70 = create_type_object((Context *)pvVar4,type);
      (**(code **)(*(long *)(*obj_local + 8) + 0x30))
                (local_48,local_70,*(undefined8 *)(*obj_local + 0x10));
    }
  }
  else if (AVar1 == Get) {
    pAVar2 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                       ((unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_> *)module);
    wabt::string_view::string_view((string_view *)&global,&pAVar2->name);
    resultArr = wabt::Module::GetExport((Module *)this,_global);
    if (((Export *)resultArr)->kind != Global) {
      __assert_fail("export_->kind == ExternalKind::Global",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,0xf8,
                    "void write_action_result_type(Context *, Js::Var, PropertyId, Script *, const ActionPtr &)"
                   );
    }
    pGVar3 = wabt::Module::GetGlobal((Module *)export_,&((Export *)resultArr)->var);
    pvVar4 = create_type_object((Context *)obj_local,pGVar3->type);
    (**(code **)(*(long *)(*obj_local + 8) + 0x30))
              (local_48,pvVar4,*(undefined8 *)(*obj_local + 0x10));
  }
  return;
}

Assistant:

void write_action_result_type(Context* ctx, Js::Var obj, PropertyId id, Script* script, const ActionPtr& action)
{
    const Module* module = script->GetModule(action->module_var);
    const Export* export_;
    Js::Var resultArr = ctx->chakra->spec->createArray(ctx->chakra->user_data);
    set_property(ctx, obj, id, resultArr, "Unable to set action result type");

    switch (action->type())
    {
    case ActionType::Invoke:
    {
        export_ = module->GetExport(action->name);
        assert(export_->kind == ExternalKind::Func);
        const Func* func = module->GetFunc(export_->var);
        wabt::Index num_results = func->GetNumResults();
        wabt::Index i;
        for (i = 0; i < num_results; ++i)
        {
            Js::Var typeObj = create_type_object(ctx, func->GetResultType(i));
            ctx->chakra->spec->push(resultArr, typeObj, ctx->chakra->user_data);
        }
        break;
    }

    case ActionType::Get:
    {
        export_ = module->GetExport(action->name);
        assert(export_->kind == ExternalKind::Global);
        const Global* global = module->GetGlobal(export_->var);
        Js::Var typeObj = create_type_object(ctx, global->type);
        ctx->chakra->spec->push(resultArr, typeObj, ctx->chakra->user_data);
        break;
    }
    }
}